

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bit_cost_t __thiscall
lzham::lzcompressor::state::get_cost
          (state *this,CLZBase *lzbase,search_accelerator *dict,lzdecision *lzdec)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  char *pcVar6;
  bit_cost_t bVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int limit;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  
  uVar2 = lzdec->m_pos;
  iVar12 = uVar2 - this->m_block_start_dict_ofs;
  if (iVar12 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)(dict->m_dict).m_p[uVar2 - 1];
  }
  uVar13 = (this->super_state_base).m_cur_state;
  uVar9 = (ulong)uVar13;
  iVar3 = lzdec->m_len;
  uVar1 = *(ushort *)
           ((long)(&this->super_state_base + 1) + (ulong)(uVar13 << 6 | uVar5 >> 2) * 2 + 4);
  uVar15 = 0x800 - uVar1;
  if (iVar3 < 1) {
    uVar15 = (uint)uVar1;
  }
  uVar14 = (ulong)*(uint *)(gProbCost + (ulong)uVar15 * 4);
  if (iVar3 < 1) {
    puVar4 = (dict->m_dict).m_p;
    bVar8 = puVar4[uVar2];
    if (uVar13 < 7) {
      uVar13 = 0;
      if (1 < iVar12) {
        uVar13 = puVar4[uVar2 - 2] >> 2 & 0x38;
      }
      pcVar6 = this->m_lit_table[0].m_unused_alignment +
               ((ulong)((uVar5 >> 5 | uVar13) << 7) - 0x30);
    }
    else {
      uVar5 = (this->super_state_base).m_match_hist[0];
      bVar8 = bVar8 ^ puVar4[uVar2 - uVar5 & dict->m_max_dict_size_mask];
      pcVar6 = this->m_delta_lit_table[0].m_unused_alignment +
               ((ulong)(((uint)(puVar4[uVar2 - uVar5 & dict->m_max_dict_size_mask] >> 5) +
                        (uint)(puVar4[~uVar5 + uVar2 & dict->m_max_dict_size_mask] >> 5) * 8) * 0x80
                       ) - 0x30);
    }
    return (long)(int)((uint)*(byte *)(*(long *)pcVar6 + (ulong)bVar8) << 0x18) + uVar14;
  }
  uVar2 = lzdec->m_dist;
  uVar1 = *(ushort *)((long)this->m_lit_table + uVar9 * 2 + -0x7c);
  if ((int)uVar2 < 0) {
    if (uVar2 == 0xffffffff) {
      lVar11 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4) + uVar14 +
               (ulong)*(uint *)(gProbCost +
                               (ulong)(0x800 - *(ushort *)
                                                ((long)this->m_lit_table + uVar9 * 2 + -100)) * 4);
      uVar1 = *(ushort *)((long)this->m_lit_table + uVar9 * 2 + -0x4c);
      if (iVar3 != 1) {
        lVar10 = (long)(int)((uint)this->m_rep_len_table[6 < uVar13].
                                   super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                   [iVar3 - 2] << 0x18) +
                 (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
        goto LAB_00108e84;
      }
      uVar9 = (ulong)(0x800 - uVar1);
LAB_00108da1:
      uVar2 = *(uint *)(gProbCost + uVar9 * 4);
    }
    else {
      lVar11 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4) + uVar14 +
               (ulong)*(uint *)(gProbCost +
                               (ulong)*(ushort *)((long)this->m_lit_table + uVar9 * 2 + -100) * 4) +
               (long)(int)((uint)this->m_rep_len_table[6 < uVar13].
                                 super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                 [iVar3 - 2] << 0x18);
      uVar1 = *(ushort *)((long)this->m_lit_table + uVar9 * 2 + -0x34);
      if (uVar2 != 0xfffffffe) {
        lVar11 = lVar11 + (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
        uVar1 = *(ushort *)(this->m_lit_table[0].m_unused_alignment + uVar9 * 2 + -0x6c);
        uVar9 = (ulong)uVar1;
        if (uVar2 != 0xfffffffd) goto LAB_00108da1;
      }
      uVar2 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4);
    }
    bVar7 = lVar11 + (ulong)uVar2;
  }
  else {
    if (uVar2 < 0x1000) {
      uVar5 = (uint)lzbase->m_slot_tab0[uVar2];
    }
    else if (uVar2 < 0x100000) {
      uVar5 = (uint)lzbase->m_slot_tab1[uVar2 >> 0xb];
    }
    else if (uVar2 < 0x1000000) {
      uVar5 = (uint)lzbase->m_slot_tab2[uVar2 >> 0x10];
    }
    else if (uVar2 < 0x2000000) {
      uVar5 = (uVar2 - 0x1000000 >> 0x17) + 0x30;
    }
    else if (uVar2 < 0x4000000) {
      uVar5 = (uVar2 + 0xfe000000 >> 0x18) + 0x32;
    }
    else {
      uVar5 = (uVar2 + 0xfc000000 >> 0x19) + 0x34;
    }
    lVar11 = *(uint *)(gProbCost + (ulong)uVar1 * 4) + uVar14;
    if (iVar3 < 9) {
      uVar13 = iVar3 - 2;
    }
    else {
      lVar11 = lVar11 + (int)((uint)this->m_large_len_table[6 < uVar13].
                                    super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                    [iVar3 - 9] << 0x18);
      uVar13 = 7;
    }
    lVar11 = (int)((uint)(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model.
                         m_code_sizes.m_p[(uVar5 * 8 - 8 | uVar13) + 2] << 0x18) + lVar11;
    bVar8 = (lzbase->super_CLZDecompBase).m_lzx_position_extra_bits[uVar5];
    if (2 < bVar8) {
      uVar9 = 0;
      if (4 < bVar8) {
        uVar9 = (ulong)((uint)bVar8 * 0x1000000 + 0xfc000000);
      }
      return (long)(int)((uint)(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model.
                               m_code_sizes.m_p
                               [(lzbase->super_CLZDecompBase).m_lzx_position_extra_mask[uVar5] &
                                uVar2 - (lzbase->super_CLZDecompBase).m_lzx_position_base[uVar5] &
                                0xf] << 0x18) + uVar9 + lVar11;
    }
    lVar10 = (ulong)bVar8 << 0x18;
LAB_00108e84:
    bVar7 = lVar11 + lVar10;
  }
  return bVar7;
}

Assistant:

bit_cost_t lzcompressor::state::get_cost(CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec) const
   {
      const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, m_cur_state);
      LZHAM_ASSERT(is_match_model_index < LZHAM_ARRAY_SIZE(m_is_match_model));
      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(lzdec.is_match());

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            const uint lit_pred1 = get_pred_char(dict, lzdec.m_pos, 2);

            uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
                            (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

            // literal
            cost += m_lit_table[lit_pred].get_cost(lit);
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            const uint rep_lit1 = dict[(lzdec.m_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

            uint delta_lit = rep_lit0 ^ lit;

            uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
                            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

            cost += m_delta_lit_table[lit_pred].get_cost(delta_lit);
         }
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            cost += m_is_rep_model[m_cur_state].get_cost(1);

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               cost += m_is_rep0_model[m_cur_state].get_cost(1);

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(1);
               }
               else
               {
                  // normal rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(0);

                  cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);
               }
            }
            else
            {
               cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);

               // rep1-rep3 match
               cost += m_is_rep0_model[m_cur_state].get_cost(0);

               if (match_hist_index == 1)
               {
                  // rep1
                  cost += m_is_rep1_model[m_cur_state].get_cost(1);
               }
               else
               {
                  cost += m_is_rep1_model[m_cur_state].get_cost(0);

                  if (match_hist_index == 2)
                  {
                     // rep2
                     cost += m_is_rep2_model[m_cur_state].get_cost(1);
                  }
                  else
                  {
                     LZHAM_ASSERT(match_hist_index == 3);
                     // rep3
                     cost += m_is_rep2_model[m_cur_state].get_cost(0);
                  }
               }
            }
         }
         else
         {
            cost += m_is_rep_model[m_cur_state].get_cost(0);

            LZHAM_ASSERT(lzdec.m_len >= cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;
               cost += m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - 9);
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
               cost += (num_extra_bits << cBitCostScaleShift);
            else
            {
               if (num_extra_bits > 4)
                  cost += ((num_extra_bits - 4) << cBitCostScaleShift);

               cost += m_dist_lsb_table.get_cost(match_extra & 15);
            }
         }
      }

      return cost;
   }